

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

ssize_t __thiscall
fmt::v6::internal::
arg_formatter_base<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>,_fmt::v6::internal::error_handler>
::write(arg_formatter_base<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>,_fmt::v6::internal::error_handler>
        *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  checked_ptr<typename_buffer<char>::value_type> __dest;
  void *pvVar1;
  char *__src;
  basic_string_view<char> s;
  
  __src = "false";
  if (__fd != 0) {
    __src = "true";
  }
  s.size_ = (ulong)(uint)__fd ^ 5;
  if (this->specs_ != (format_specs *)0x0) {
    s.data_ = __src;
    basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
    ::write<char>(&this->writer_,s,this->specs_);
    return extraout_RAX;
  }
  __dest = reserve<fmt::v6::internal::buffer<char>,_0>
                     ((back_insert_iterator<fmt::v6::internal::buffer<char>_> *)this,s.size_);
  if (s.size_ != 0) {
    pvVar1 = memmove(__dest,__src,s.size_);
    return (ssize_t)pvVar1;
  }
  return (ssize_t)__dest;
}

Assistant:

void write(bool value) {
    string_view sv(value ? "true" : "false");
    specs_ ? writer_.write(sv, *specs_) : writer_.write(sv);
  }